

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask.pb.cc
# Opt level: O3

void __thiscall google::protobuf::FieldMask::InternalSwap(FieldMask *this,FieldMask *other)

{
  void *pvVar1;
  UnknownFieldSet *other_00;
  
  pvVar1 = (other->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    if (((ulong)pvVar1 & 1) == 0) goto LAB_002b87b6;
LAB_002b87a5:
    other_00 = (UnknownFieldSet *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 8);
  }
  else {
    if (((ulong)pvVar1 & 1) != 0) goto LAB_002b87a5;
    other_00 = internal::InternalMetadata::
               mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                         (&(other->super_Message).super_MessageLite._internal_metadata_);
  }
  internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_,other_00);
LAB_002b87b6:
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->paths_).super_RepeatedPtrFieldBase,&(other->paths_).super_RepeatedPtrFieldBase)
  ;
  return;
}

Assistant:

void FieldMask::InternalSwap(FieldMask* other) {
  using std::swap;
  _internal_metadata_.Swap<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(&other->_internal_metadata_);
  paths_.InternalSwap(&other->paths_);
}